

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLsMPSolve(void *arkode_mem,N_Vector r,N_Vector z,sunrealtype tol,int lr)

{
  int iVar1;
  ARKLsMassMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMassMem local_30;
  ARKodeMem local_28;
  
  iVar1 = arkLs_AccessARKODEMassMem(arkode_mem,"arkLsMPSolve",&local_28,&local_30);
  if (iVar1 == 0) {
    iVar1 = (*local_30->psolve)(local_28->tcur,r,z,tol,lr,local_30->P_data);
    local_30->nps = local_30->nps + 1;
  }
  return iVar1;
}

Assistant:

int arkLsMPSolve(void* arkode_mem, N_Vector r, N_Vector z, sunrealtype tol, int lr)
{
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  int retval;

  /* access ARKodeMem and ARKLsMassMem structures */
  retval = arkLs_AccessARKODEMassMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* call the user-supplied psolve routine, and accumulate count */
  retval = arkls_mem->psolve(ark_mem->tcur, r, z, tol, lr, arkls_mem->P_data);
  arkls_mem->nps++;
  return (retval);
}